

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::createShaderProgs(SourceCollections *dst)

{
  ProgramSources *this;
  allocator<char> local_91;
  string local_90;
  ShaderSource local_70;
  allocator<char> local_31;
  string local_30;
  SourceCollections *local_10;
  SourceCollections *dst_local;
  
  local_10 = dst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"test",&local_31);
  this = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void) { gl_Position = a_position; }\n"
             ,&local_91);
  glu::VertexSource::VertexSource((VertexSource *)&local_70,&local_90);
  glu::ProgramSources::operator<<(this,&local_70);
  glu::VertexSource::~VertexSource((VertexSource *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void createShaderProgs (SourceCollections& dst)
{
	dst.glslSources.add("test") << glu::VertexSource(
		"#version 310 es\n"
		"in highp vec4 a_position;\n"
		"void main (void) { gl_Position = a_position; }\n");
}